

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pub-sub.c
# Opt level: O0

void ps_publish_command(uint8_t service,char *scope,ps_event_t *event)

{
  ndn_key_storage_t *component;
  ndn_time_ms_t nVar1;
  size_t sVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  uint local_438;
  int local_434;
  uint32_t buffer_length;
  int i_3;
  ndn_ecc_prv_t *signing_identity_key;
  ndn_name_t *signing_identity;
  ndn_aes_key_t *pnStack_418;
  uint32_t default_freshness_period;
  ndn_aes_key_t *service_aes_key;
  uint32_t used_size;
  name_component_t tp_comp;
  ndn_time_ms_t tp;
  int i_2;
  ndn_name_t scope_name;
  int i_1;
  int index;
  uint64_t min_last_tp;
  pub_topic_t *ppStack_200;
  int i;
  pub_topic_t *topic;
  ndn_key_storage_t *storage;
  ndn_name_t name;
  int ret;
  ps_event_t *event_local;
  char *scope_local;
  uint8_t service_local;
  
  unique0x100008e3 = event;
  scope_local._7_1_ = service;
  if (!m_has_initialized) {
    _ps_topics_init();
  }
  name.components[9].size = '\0';
  name.components[9]._41_3_ = 0;
  ndn_name_init((ndn_name_t *)&storage);
  component = ndn_key_storage_get_instance();
  ndn_name_append_component((ndn_name_t *)&storage,(name_component_t *)component);
  ndn_name_append_bytes_component((ndn_name_t *)&storage,(uint8_t *)((long)&scope_local + 7),1);
  ndn_name_append_string_component((ndn_name_t *)&storage,"CMD",3);
  ppStack_200 = _match_pub_topic(scope_local._7_1_,true);
  if (ppStack_200 == (pub_topic_t *)0x0) {
    for (min_last_tp._4_4_ = 0; min_last_tp._4_4_ < 5; min_last_tp._4_4_ = min_last_tp._4_4_ + 1) {
      if (m_pub_sub_state.pub_topics[min_last_tp._4_4_].service == 0xff) {
        ppStack_200 = m_pub_sub_state.pub_topics + min_last_tp._4_4_;
      }
    }
    if (ppStack_200 == (pub_topic_t *)0x0) {
      printf("INFO: %s: ","ps_publish_command");
      printf("[PUB/SUB] No availble topic, will drop the oldest pub topic.");
      printf("\n");
      _i_1 = m_pub_sub_state.pub_topics[0].last_update_tp;
      scope_name.components_size = 0xff;
      scope_name._441_3_ = 0xffffff;
      scope_name.components[9].size = '\x01';
      scope_name.components[9]._41_3_ = 0;
      for (; (int)scope_name.components[9]._40_4_ < 5;
          scope_name.components[9]._40_4_ = scope_name.components[9]._40_4_ + 1) {
        if (m_pub_sub_state.pub_topics[(int)scope_name.components[9]._40_4_].last_update_tp < _i_1)
        {
          _i_1 = m_pub_sub_state.pub_topics[(int)scope_name.components[9]._40_4_].last_update_tp;
          scope_name.components_size = scope_name.components[9].size;
          scope_name._441_3_ = scope_name.components[9]._41_3_;
        }
      }
      ppStack_200 = m_pub_sub_state.pub_topics + (int)scope_name._440_4_;
    }
    name.components[9]._40_4_ =
         ndn_forwarder_register_name_prefix
                   ((ndn_name_t *)&storage,_on_subscription_interest,ppStack_200);
    if (name.components[9]._40_4_ != 0) {
      printf("ERROR: %s, L%d: ","ps_publish_command",0x2c8);
      printf("[PUB/SUB] Cannot register prefix for newly published command. Error Code: %d");
    }
    ppStack_200->service = scope_local._7_1_;
    ppStack_200->is_cmd = true;
  }
  nVar1 = ndn_time_now_ms();
  ppStack_200->last_update_tp = nVar1;
  memset(ppStack_200->cache,0,300);
  sVar2 = strlen(scope);
  if (sVar2 != 0) {
    sVar2 = strlen(scope);
    ndn_name_from_string((ndn_name_t *)((long)&tp + 4),scope,(uint32_t)sVar2);
    for (tp._0_4_ = 0; (int)tp < (int)(uint)scope_name.components[9].value[0x20];
        tp._0_4_ = (int)tp + 1) {
      ndn_name_append_component
                ((ndn_name_t *)&storage,(name_component_t *)((long)&tp + (long)(int)tp * 0x2c + 4));
    }
  }
  ndn_name_append_bytes_component
            ((ndn_name_t *)&storage,stack0xffffffffffffffd0->data_id,
             stack0xffffffffffffffd0->data_id_len);
  tp_comp._36_8_ = ndn_time_now_ms();
  name_component_from_timestamp((name_component_t *)((long)&service_aes_key + 4),tp_comp._36_8_);
  ndn_name_append_component((ndn_name_t *)&storage,(name_component_t *)((long)&service_aes_key + 4))
  ;
  m_measure_tp1 = ndn_time_now_us();
  service_aes_key._0_4_ = 0;
  pnStack_418 = ndn_ac_get_key_for_service(ppStack_200->service);
  name.components[9]._40_4_ =
       ndn_gen_encrypted_payload
                 (stack0xffffffffffffffd0->payload,stack0xffffffffffffffd0->payload_len,
                  pkt_encoding_buf,(uint32_t *)&service_aes_key,pnStack_418->key_id,(uint8_t *)0x0,0
                 );
  if (name.components[9]._40_4_ == 0) {
    m_measure_tp2 = ndn_time_now_us();
    printf("DEBUG: %s, L%d: ","ps_publish_command",0x2f0);
    printf("[PUB/SUB] PUB-COMMAND-DATA-AES-ENC: %lu\n",m_measure_tp2 - m_measure_tp1);
    if (stack0xffffffffffffffd0->freshness_period == 0) {
      signing_identity._4_4_ = 8000;
    }
    else {
      signing_identity._4_4_ = stack0xffffffffffffffd0->freshness_period;
    }
    signing_identity_key = (ndn_ecc_prv_t *)ndn_key_storage_get_self_identity(scope_local._7_1_);
    _buffer_length = ndn_key_storage_get_self_identity_key(scope_local._7_1_);
    if ((signing_identity_key == (ndn_ecc_prv_t *)0x0) || (_buffer_length == (ndn_ecc_prv_t *)0x0))
    {
      printf("ERROR: %s, L%d: ","ps_publish_command",0x2ff);
      printf("[PUB/SUB] Cannot find proper identity to sign");
    }
    else {
      uVar3 = 0;
      name.components[9]._40_4_ =
           tlv_make_data(ppStack_200->cache,300,(size_t *)&ppStack_200->cache_size,7,0,&storage,8,
                         pkt_encoding_buf,9,service_aes_key._0_4_,4,(ulong)signing_identity._4_4_,10
                         ,3,0xb,signing_identity_key,0xc,_buffer_length);
      printf("DEBUG: %s, L%d: ","ps_publish_command",0x30a);
      printf("[PUB/SUB] PUB-CMD-PKT-SIZE: %u Bytes\n",(ulong)ppStack_200->cache_size);
      printf("INFO: %s: ","ps_publish_command");
      printf("[PUB/SUB] CMD Data has been generated");
      printf("\n");
      ndn_name_print((ndn_name_t *)&storage);
      ndn_name_init((ndn_name_t *)&storage);
      ndn_name_append_component((ndn_name_t *)&storage,(name_component_t *)component);
      ndn_name_append_bytes_component((ndn_name_t *)&storage,(uint8_t *)((long)&scope_local + 7),1);
      ndn_name_append_string_component((ndn_name_t *)&storage,"NOTIFY",6);
      ndn_name_append_string_component((ndn_name_t *)&storage,"CMD",3);
      sVar2 = strlen(scope);
      uVar4 = (undefined4)((ulong)uVar3 >> 0x20);
      if (sVar2 != 0) {
        for (local_434 = 0; uVar4 = (undefined4)((ulong)uVar3 >> 0x20),
            local_434 < (int)(uint)scope_name.components[9].value[0x20]; local_434 = local_434 + 1)
        {
          ndn_name_append_component
                    ((ndn_name_t *)&storage,
                     (name_component_t *)((long)&tp + (long)local_434 * 0x2c + 4));
        }
      }
      ndn_name_append_bytes_component
                ((ndn_name_t *)&storage,stack0xffffffffffffffd0->data_id,
                 stack0xffffffffffffffd0->data_id_len);
      ndn_name_append_component
                ((ndn_name_t *)&storage,(name_component_t *)((long)&service_aes_key + 4));
      local_438 = 0;
      tlv_make_interest(pkt_encoding_buf,0x200,(size_t *)&local_438,3,0,&storage,3,CONCAT44(uVar4,1)
                        ,4,1);
      m_is_my_own_int = true;
      name.components[9]._40_4_ =
           ndn_forwarder_express_interest
                     (pkt_encoding_buf,(ulong)local_438,_on_new_content,_on_sub_timeout,(void *)0x0)
      ;
      m_is_my_own_int = false;
      printf("INFO: %s: ","ps_publish_command");
      printf("[PUB/SUB] Sent notification Interest for the newly generated cmd");
      printf("\n");
      ndn_name_print((ndn_name_t *)&storage);
    }
  }
  else {
    printf("ERROR: %s, L%d: ","ps_publish_command",0x2ea);
    printf("[PUB/SUB] Cannot encrypt command payload to publish. Error code: %d",
           (ulong)(uint)name.components[9]._40_4_);
  }
  return;
}

Assistant:

void
ps_publish_command(uint8_t service, const char* scope, const ps_event_t* event)
{
  if (!m_has_initialized)
    _ps_topics_init();

  int ret = 0;
  // Prefix FORMAT: /home/service/CMD
  ndn_name_t name;
  ndn_name_init(&name);
  ndn_key_storage_t* storage = ndn_key_storage_get_instance();
  ndn_name_append_component(&name, &storage->self_identity[0].components[0]);
  ndn_name_append_bytes_component(&name, &service, sizeof(service));
  ndn_name_append_string_component(&name, "CMD", strlen("CMD"));

  // published on this topic before? update the cache
  pub_topic_t* topic = NULL;
  topic = _match_pub_topic(service, true);
  if (!topic) {
    for (int i = 0; i < 5; i++) {
      if (m_pub_sub_state.pub_topics[i].service == NDN_SD_NONE) {
        topic = &m_pub_sub_state.pub_topics[i];
      }
    }
    if (topic == NULL) {
      NDN_LOG_INFO("[PUB/SUB] No availble topic, will drop the oldest pub topic.");
      uint64_t min_last_tp = m_pub_sub_state.pub_topics[0].last_update_tp;
      int index = -1;
      for (int i = 1; i < 5; i++) {
        if (m_pub_sub_state.pub_topics[i].last_update_tp < min_last_tp) {
          min_last_tp = m_pub_sub_state.pub_topics[i].last_update_tp;
          index = i;
        }
      }
      topic = &m_pub_sub_state.pub_topics[index];
      // TODO: unregister the prefix registered by the old topic
    }
    // register the new prefix
    ret = ndn_forwarder_register_name_prefix(&name, _on_subscription_interest, topic);
    if (ret != NDN_SUCCESS) {
      NDN_LOG_ERROR("[PUB/SUB] Cannot register prefix for newly published command. Error Code: %d", ret);
    }
    topic->service = service;
    topic->is_cmd = true;
  }
  topic->last_update_tp = ndn_time_now_ms();
  memset(topic->cache, 0, sizeof(topic->cache));

  // Append the last several component to the Data name
  // Data name FORMAT: /home/service/CMD/identifier[0,2]/command-id
  ndn_name_t scope_name;
  if (strlen(scope) > 0) {
    ndn_name_from_string(&scope_name, scope, strlen(scope));
    for (int i = 0; i < scope_name.components_size; i++) {
      ndn_name_append_component(&name, &scope_name.components[i]);
    }
  }
  ndn_name_append_bytes_component(&name, event->data_id, event->data_id_len);
  // TODO: currently I appended timestamp. Further discussion is needed.
  ndn_time_ms_t tp = ndn_time_now_ms();
  name_component_t tp_comp;
  name_component_from_timestamp(&tp_comp, tp);
  ndn_name_append_component(&name, &tp_comp);

#if ENABLE_NDN_LOG_DEBUG
  m_measure_tp1 = ndn_time_now_us();
#endif

  // Encrypt payload
  uint32_t used_size = 0;
  ndn_aes_key_t* service_aes_key = ndn_ac_get_key_for_service(topic->service);
  ret = ndn_gen_encrypted_payload(event->payload, event->payload_len, pkt_encoding_buf, &used_size,
                                  service_aes_key->key_id, NULL, 0);
  if (ret != NDN_SUCCESS) {
    NDN_LOG_ERROR("[PUB/SUB] Cannot encrypt command payload to publish. Error code: %d", ret);
    return;
  }

#if ENABLE_NDN_LOG_DEBUG
  m_measure_tp2 = ndn_time_now_us();
  NDN_LOG_DEBUG("[PUB/SUB] PUB-COMMAND-DATA-AES-ENC: %" PRI_ndn_time_us_t "\n", m_measure_tp2 - m_measure_tp1);
#endif

  uint32_t default_freshness_period = 0;
  if (!event->freshness_period) {
    // this user does not define the freshness period, it will pick 8000ms as default
    default_freshness_period = 8000;
  }
  else {
    default_freshness_period = event->freshness_period;
  }
  // select identity key
  ndn_name_t* signing_identity = ndn_key_storage_get_self_identity(service);
  ndn_ecc_prv_t* signing_identity_key = ndn_key_storage_get_self_identity_key(service);
  if (signing_identity == NULL || signing_identity_key == NULL) {
    NDN_LOG_ERROR("[PUB/SUB] Cannot find proper identity to sign");
    return;
  }
  ret = tlv_make_data(topic->cache, sizeof(topic->cache), (size_t *) &topic->cache_size, 7,
                      TLV_DATAARG_NAME_PTR, &name,
                      TLV_DATAARG_CONTENT_BUF, pkt_encoding_buf,
                      TLV_DATAARG_CONTENT_SIZE, used_size,
                      TLV_DATAARG_FRESHNESSPERIOD_U64, (uint64_t)default_freshness_period,
                      TLV_DATAARG_SIGTYPE_U8, NDN_SIG_TYPE_ECDSA_SHA256,
                      TLV_DATAARG_IDENTITYNAME_PTR, signing_identity,
                      TLV_DATAARG_SIGKEY_PTR, signing_identity_key);
  NDN_LOG_DEBUG("[PUB/SUB] PUB-CMD-PKT-SIZE: %u Bytes\n", topic->cache_size);
  NDN_LOG_INFO("[PUB/SUB] CMD Data has been generated");
  NDN_LOG_INFO_NAME(&name);

  // express the /Notify Interest
  // FORMAT: /home/service/NOTIFY/CMD/identifier[0,2]/action
  ndn_name_init(&name);
  ndn_name_append_component(&name, &storage->self_identity[0].components[0]);
  ndn_name_append_bytes_component(&name, &service, sizeof(service));
  ndn_name_append_string_component(&name, "NOTIFY", strlen("NOTIFY"));
  ndn_name_append_string_component(&name, "CMD", strlen("CMD"));
  if (strlen(scope) > 0) {
    for (int i = 0; i < scope_name.components_size; i++) {
      ndn_name_append_component(&name, &scope_name.components[i]);
    }
  }
  ndn_name_append_bytes_component(&name, event->data_id, event->data_id_len);
  ndn_name_append_component(&name, &tp_comp);

  // send out the notification Interest
  uint32_t buffer_length = 0;
  tlv_make_interest(pkt_encoding_buf, sizeof(pkt_encoding_buf), (size_t *) &buffer_length, 3,
                    TLV_INTARG_NAME_PTR, &name,
                    TLV_INTARG_CANBEPREFIX_BOOL, true,
                    TLV_INTARG_MUSTBEFRESH_BOOL, true);
  m_is_my_own_int = true;
  ret = ndn_forwarder_express_interest(pkt_encoding_buf, buffer_length, _on_new_content, _on_sub_timeout, NULL);
  m_is_my_own_int = false;
  NDN_LOG_INFO("[PUB/SUB] Sent notification Interest for the newly generated cmd");
  NDN_LOG_INFO_NAME(&name);
}